

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ryg_dxt.cpp
# Opt level: O2

void __thiscall
ryg_dxt::sCompressDXTBlock(ryg_dxt *this,sU8 *dest,sU32 *src,sBool alpha,sInt quality)

{
  byte bVar1;
  byte bVar2;
  anon_struct_4_4_d8359877_for_Pixel_0 aVar3;
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [15];
  undefined1 auVar10 [13];
  int *piVar11;
  ushort uVar12;
  ushort c1;
  sInt ch_1;
  sU32 sVar13;
  int iVar14;
  Pixel *pPVar15;
  int iVar16;
  undefined7 in_register_00000009;
  long lVar17;
  int *piVar18;
  Pixel *pPVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  sU8 *psVar26;
  sInt i;
  int iVar27;
  int iVar28;
  undefined1 *puVar29;
  ulong uVar30;
  long lVar31;
  ushort c1_00;
  sInt i_5;
  int iVar32;
  ushort uVar33;
  uint uVar34;
  int iVar35;
  int *piVar36;
  int iVar37;
  bool bVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  int iVar43;
  int iVar44;
  float fVar45;
  float fVar46;
  sInt err [8];
  sInt max [3];
  sInt min [3];
  sInt mu [3];
  Pixel local_a0;
  Pixel local_9c;
  sF32 covf [6];
  Pixel dblock [16];
  
  psVar26 = (sU8 *)(ulong)(uint)quality;
  iVar16 = (int)CONCAT71(in_register_00000009,alpha);
  if ((int)src != 0) {
    CompressAlphaBlock((sU8 *)this,(sU32 *)dest);
    this = this + 8;
  }
  uVar22 = *(uint *)dest;
  uVar24 = uVar22;
  uVar34 = uVar22;
  for (lVar17 = 1; lVar17 != 0x10; lVar17 = lVar17 + 1) {
    uVar23 = *(uint *)(dest + lVar17 * 4);
    psVar26 = (sU8 *)(ulong)uVar23;
    if (uVar23 <= uVar24) {
      uVar24 = uVar23;
    }
    if (uVar34 <= uVar23) {
      uVar34 = uVar23;
    }
  }
  if (uVar24 == uVar34) {
    uVar30 = (ulong)(uVar22 >> 0x10 & 0xff);
    uVar25 = (ulong)(uVar22 >> 8 & 0xff);
    uVar24 = 0xaaaaaaaa;
    c1 = (ushort)(byte)OMatch5[(ulong)(uVar22 & 0xff) * 2 + 1] |
         (ushort)(byte)OMatch6[uVar25 * 2 + 1] << 5 | (ushort)(byte)OMatch5[uVar30 * 2 + 1] << 0xb;
    uVar12 = (ushort)(byte)OMatch5[(ulong)(uVar22 & 0xff) * 2] |
             (ushort)(byte)OMatch6[uVar25 * 2] << 5 | (ushort)(byte)OMatch5[uVar30 * 2] << 0xb;
  }
  else {
    pPVar15 = (Pixel *)dest;
    if (iVar16 != 0) {
      piVar36 = err;
      pPVar15 = dblock;
      piVar18 = err + 4;
      psVar26 = dest;
      for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
        puVar29 = &QuantRBTab;
        if (lVar17 == 1) {
          puVar29 = &QuantGTab;
        }
        err[4] = 0;
        err[5] = 0;
        err[6] = 0;
        err[7] = 0;
        err[0] = 0;
        err[1] = 0;
        err[2] = 0;
        err[3] = 0;
        piVar11 = piVar18;
        for (lVar31 = 0; piVar18 = piVar11, (int)lVar31 != 0x40; lVar31 = lVar31 + 0x10) {
          bVar1 = psVar26[lVar31];
          bVar2 = puVar29[(long)(*piVar18 * 5 + piVar18[1] * 3 >> 4) + (ulong)bVar1 + 8];
          *(byte *)((long)pPVar15 + lVar31) = bVar2;
          iVar37 = (uint)bVar1 - (uint)bVar2;
          *piVar36 = iVar37;
          bVar1 = psVar26[lVar31 + 4];
          bVar2 = puVar29[(long)(piVar18[1] * 5 + piVar18[2] * 3 + iVar37 * 7 + *piVar18 >> 4) +
                          (ulong)bVar1 + 8];
          *(byte *)((long)pPVar15 + lVar31 + 4) = bVar2;
          iVar37 = (uint)bVar1 - (uint)bVar2;
          piVar36[1] = iVar37;
          bVar1 = psVar26[lVar31 + 8];
          bVar2 = puVar29[(long)(piVar18[2] * 5 + piVar18[3] * 3 + iVar37 * 7 + piVar18[1] >> 4) +
                          (ulong)bVar1 + 8];
          *(byte *)((long)pPVar15 + lVar31 + 8) = bVar2;
          iVar37 = (uint)bVar1 - (uint)bVar2;
          piVar36[2] = iVar37;
          bVar1 = psVar26[lVar31 + 0xc];
          bVar2 = puVar29[(long)(piVar18[3] * 5 + iVar37 * 7 + piVar18[2] >> 4) + (ulong)bVar1 + 8];
          *(byte *)((long)pPVar15 + lVar31 + 0xc) = bVar2;
          piVar36[3] = (uint)bVar1 - (uint)bVar2;
          piVar11 = piVar36;
          piVar36 = piVar18;
        }
        psVar26 = psVar26 + 1;
        pPVar15 = (Pixel *)&(pPVar15->field_0).g;
      }
      pPVar15 = dblock;
    }
    pPVar19 = pPVar15;
    for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
      uVar34 = (uint)*(byte *)((long)pPVar15 + lVar17);
      uVar22 = (uint)*(byte *)((long)pPVar15 + lVar17);
      uVar24 = uVar22;
      for (uVar30 = 4; uVar30 < 0x40; uVar30 = uVar30 + 4) {
        bVar1 = *(byte *)((long)pPVar19 + uVar30);
        uVar24 = uVar24 + bVar1;
        uVar23 = (uint)bVar1;
        if (uVar23 <= uVar22) {
          uVar22 = uVar23;
        }
        if (uVar34 <= uVar23) {
          uVar34 = (uint)bVar1;
        }
      }
      uVar24 = uVar24 + 8 >> 4;
      psVar26 = (sU8 *)(ulong)uVar24;
      mu[lVar17] = uVar24;
      min[lVar17] = uVar22;
      max[lVar17] = uVar34;
      pPVar19 = (Pixel *)&(pPVar19->field_0).g;
    }
    for (lVar17 = 0; lVar17 != 6; lVar17 = lVar17 + 1) {
      err[lVar17] = 0;
    }
    for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 1) {
      iVar37 = (uint)*(byte *)((long)pPVar15 + lVar17 * 4 + 2) - mu[2];
      aVar3 = pPVar15[lVar17].field_0;
      uVar30 = (ulong)aVar3._0_2_ & 0xffffffffffff00ff;
      auVar5._8_4_ = 0;
      auVar5._0_8_ = uVar30;
      auVar5[0xc] = aVar3.a;
      auVar6[8] = aVar3.r;
      auVar6._0_8_ = uVar30;
      auVar6[9] = 0;
      auVar6._10_3_ = auVar5._10_3_;
      auVar8._5_8_ = 0;
      auVar8._0_5_ = auVar6._8_5_;
      auVar7[4] = aVar3.g;
      auVar7._0_4_ = (int)uVar30;
      auVar7[5] = 0;
      auVar7._6_7_ = SUB137(auVar8 << 0x40,6);
      iVar43 = (int)uVar30 - mu[0];
      iVar44 = auVar7._4_4_ - mu[1];
      psVar26 = (sU8 *)(ulong)(uint)(iVar44 * iVar37);
      err[0] = err[0] + iVar37 * iVar37;
      err[1] = err[1] + iVar44 * iVar37;
      auVar9._4_4_ = iVar44;
      auVar9._0_4_ = iVar44;
      auVar9._8_4_ = iVar43;
      auVar9._12_3_ = auVar5._10_3_ >> 0x10;
      err[2] = err[2] + iVar37 * iVar43;
      err[3] = err[3] + iVar44 * iVar44;
      err[4] = err[4] + iVar43 * iVar44;
      err[5] = err[5] + (int)(((ulong)auVar9._8_7_ & 0xffffffff) *
                             ((ulong)auVar9._8_7_ & 0xffffffff));
    }
    for (lVar17 = 0; lVar17 != 6; lVar17 = lVar17 + 1) {
      covf[lVar17] = (sF32)((float)err[lVar17] / 255.0);
    }
    fVar39 = (float)((int)max._0_8_ - (int)min._0_8_);
    fVar41 = (float)(SUB84(max._0_8_,4) - SUB84(min._0_8_,4));
    iVar37 = 4;
    fVar40 = (float)(max[2] - min[2]);
    while (bVar38 = iVar37 != 0, iVar37 = iVar37 + -1, bVar38) {
      fVar46 = (float)covf._4_8_ * fVar41;
      fVar45 = fVar39 * SUB84(covf._4_8_,4);
      fVar42 = fVar39 * (float)covf._16_8_;
      fVar39 = fVar39 * SUB84(covf._16_8_,4) +
               fVar40 * SUB84(covf._4_8_,4) + fVar41 * (float)covf._16_8_;
      fVar41 = fVar42 + fVar40 * (float)covf._4_8_ + fVar41 * (float)covf[3];
      fVar40 = fVar45 + fVar40 * (float)covf[0] + fVar46;
    }
    fVar42 = ABS(fVar40);
    if (ABS(fVar40) <= ABS(fVar41)) {
      fVar42 = ABS(fVar41);
    }
    if (fVar42 <= ABS(fVar39)) {
      fVar42 = ABS(fVar39);
    }
    if (4.0 <= fVar42) {
      fVar42 = 512.0 / fVar42;
      iVar37 = (int)(fVar40 * fVar42);
      iVar43 = (int)(fVar39 * fVar42);
      iVar44 = (int)(fVar41 * fVar42);
    }
    else {
      iVar43 = 0x3a;
      iVar44 = 300;
      iVar37 = 0x94;
    }
    iVar28 = -0x7fffffff;
    iVar21 = 0x7fffffff;
    local_a0.v = 0x10;
    for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 1) {
      aVar3 = pPVar15[lVar17].field_0;
      auVar4[0xc] = aVar3.a;
      auVar4._0_12_ = ZEXT712(0);
      auVar10[1] = 0;
      auVar10[0] = aVar3.r;
      auVar10._2_3_ = auVar4._10_3_;
      auVar10._5_8_ = 0;
      iVar27 = iVar43 * ((uint)aVar3 & 0xff) +
               (uint)*(byte *)((long)pPVar15 + lVar17 * 4 + 2) * iVar37 +
               (int)CONCAT72(SUB137(auVar10 << 0x40,6),(ushort)aVar3.g) * iVar44;
      if (iVar27 < iVar21) {
        psVar26 = (sU8 *)(ulong)pPVar15[lVar17].v;
        iVar21 = iVar27;
      }
      if (iVar28 < iVar27) {
        local_a0 = pPVar15[lVar17];
        iVar28 = iVar27;
      }
    }
    local_9c.v = (sU32)psVar26;
    uVar12 = Pixel::As16Bit(&local_a0);
    c1 = Pixel::As16Bit(&local_9c);
    iVar37 = 0;
    uVar24 = 0;
    if (uVar12 != c1) {
      EvalColors((Pixel *)err,uVar12,c1);
      uVar24 = MatchColorsBlock((Pixel *)dest,(Pixel *)err,iVar16 != 0);
    }
    iVar28 = 0;
    iVar27 = 0;
    iVar43 = 0;
    iVar44 = 0;
    iVar21 = 0;
    uVar22 = 0;
    sVar13 = uVar24;
    for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 1) {
      uVar30 = (ulong)((sVar13 & 3) << 2);
      iVar14 = *(int *)((long)crnlib::dxt1_endpoint_optimizer::refine_solution::w1Tab + uVar30);
      uVar22 = uVar22 + *(int *)(RefineBlock(ryg_dxt::Pixel_const*,unsigned_short&,unsigned_short&,unsigned_int)
                                 ::prods + uVar30);
      uVar34 = (uint)*(byte *)((long)pPVar15 + lVar17 * 4 + 2);
      iVar21 = iVar21 + iVar14 * uVar34;
      uVar23 = (uint)*(byte *)((long)pPVar15 + lVar17 * 4 + 1);
      iVar44 = iVar44 + iVar14 * uVar23;
      iVar43 = iVar43 + iVar14 * (uint)pPVar15[lVar17].field_0.b;
      iVar27 = iVar27 + uVar34;
      iVar28 = iVar28 + uVar23;
      iVar37 = iVar37 + (uint)pPVar15[lVar17].field_0.b;
      sVar13 = sVar13 >> 2;
    }
    uVar34 = uVar22 >> 8 & 0xff;
    if (uVar34 != 0 && 0xffff < uVar22) {
      iVar20 = (int)uVar22 >> 0x10;
      uVar22 = uVar22 & 0xff;
      iVar14 = uVar34 * iVar20 - uVar22 * uVar22;
      if (iVar14 != 0) {
        iVar32 = iVar27 * 3 - iVar21;
        iVar27 = iVar28 * 3 - iVar44;
        iVar28 = iVar37 * 3 - iVar43;
        fVar40 = 0.3647059 / (float)iVar14;
        fVar39 = (fVar40 * 63.0) / 31.0;
        iVar37 = (int)((float)(int)(uVar34 * iVar21 - uVar22 * iVar32) * fVar40 + 0.5);
        if (iVar37 < 1) {
          iVar37 = 0;
        }
        if (0x1e < iVar37) {
          iVar37 = 0x1f;
        }
        iVar14 = (int)((float)(int)(uVar34 * iVar44 - uVar22 * iVar27) * fVar39 + 0.5);
        if (iVar14 < 1) {
          iVar14 = 0;
        }
        if (0x3e < iVar14) {
          iVar14 = 0x3f;
        }
        iVar35 = (int)((float)(int)(uVar34 * iVar43 - uVar22 * iVar28) * fVar40 + 0.5);
        if (iVar35 < 1) {
          iVar35 = 0;
        }
        if (0x1e < iVar35) {
          iVar35 = 0x1f;
        }
        iVar21 = (int)((float)(int)(iVar32 * iVar20 - iVar21 * uVar22) * fVar40 + 0.5);
        uVar33 = (ushort)iVar35 | (ushort)(iVar37 << 0xb) | (ushort)(iVar14 << 5);
        if (iVar21 < 1) {
          iVar21 = 0;
        }
        if (0x1e < iVar21) {
          iVar21 = 0x1f;
        }
        iVar37 = (int)((float)(int)(iVar27 * iVar20 - iVar44 * uVar22) * fVar39 + 0.5);
        if (iVar37 < 1) {
          iVar37 = 0;
        }
        if (0x3e < iVar37) {
          iVar37 = 0x3f;
        }
        iVar43 = (int)((float)(int)(iVar28 * iVar20 - uVar22 * iVar43) * fVar40 + 0.5);
        if (iVar43 < 1) {
          iVar43 = 0;
        }
        if (0x1e < iVar43) {
          iVar43 = 0x1f;
        }
        c1_00 = (ushort)iVar43 | (ushort)(iVar21 << 0xb) | (ushort)(iVar37 << 5);
        if ((c1 != c1_00) || (uVar12 != uVar33)) {
          uVar12 = uVar33;
          if (uVar33 == c1_00) {
            uVar24 = 0;
            c1 = uVar33;
          }
          else {
            EvalColors((Pixel *)err,uVar33,c1_00);
            uVar24 = MatchColorsBlock((Pixel *)dest,(Pixel *)err,iVar16 != 0);
            c1 = c1_00;
          }
        }
      }
    }
  }
  uVar22 = uVar24 ^ 0x55555555;
  uVar33 = c1;
  if (c1 < uVar12) {
    uVar33 = uVar12;
  }
  if (c1 <= uVar12) {
    uVar22 = uVar24;
    uVar12 = c1;
  }
  *(ushort *)this = uVar33;
  *(ushort *)(this + 2) = uVar12;
  *(uint *)(this + 4) = uVar22;
  return;
}

Assistant:

void sCompressDXTBlock(sU8* dest, const sU32* src, sBool alpha, sInt quality) {
  CRNLIB_ASSERT(Expand5[1]);

  // if alpha specified, compress alpha as well
  if (alpha) {
    CompressAlphaBlock(dest, src);
    dest += 8;
  }

  // compress the color part
  CompressColorBlock(dest, src, quality);
}